

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBezierCurves(XMLLoader *this,Ref<embree::XML> *xml,CurveSubtype subtype)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  XML *pXVar3;
  pointer puVar4;
  undefined8 uVar5;
  undefined8 this_00;
  _Alloc_hider _Var6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  HairSetNode *pHVar10;
  int in_ECX;
  ulong siglen;
  undefined4 in_register_00000014;
  undefined8 *puVar11;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *sig;
  XMLLoader *ctx;
  uchar *in_R8;
  size_t in_R9;
  ulong uVar12;
  string tessellation_rate;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> indices;
  Ref<embree::SceneGraph::MaterialNode> material;
  string local_e0;
  string local_c0;
  XMLLoader *local_a0;
  undefined1 local_98 [48];
  undefined1 local_68 [32];
  Ref<embree::SceneGraph::MaterialNode> local_48;
  _Alloc_hider local_40;
  _Alloc_hider local_38;
  
  puVar11 = (undefined8 *)CONCAT44(in_register_00000014,subtype);
  psVar2 = (string *)*puVar11;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_a0 = (XMLLoader *)xml;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"material","");
  XML::child((XML *)&local_c0,psVar2);
  loadMaterial((XMLLoader *)&stack0xffffffffffffffc0,(Ref<embree::XML> *)local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_c0._M_dataplus._M_p + 0x18))();
  }
  local_38._M_p = (pointer)this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  pHVar10 = (HairSetNode *)operator_new(0x118);
  local_48.ptr = (MaterialNode *)local_40._M_p;
  local_98._32_8_ = pHVar10;
  local_98._40_8_ = puVar11;
  if ((pointer)local_40._M_p != (pointer)0x0) {
    (*(code *)((*(XML **)local_40._M_p)->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)();
  }
  uVar5 = local_98._32_8_;
  siglen = 0;
  SceneGraph::HairSetNode::HairSetNode
            ((HairSetNode *)local_98._32_8_,RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE - (in_ECX == 0),
             &local_48,(BBox1f)0x3f80000000000000,0);
  (**(code **)(*(long *)uVar5 + 0x10))(uVar5);
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*(code *)(((XML *)((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount)->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)();
  }
  uVar5 = local_98._40_8_;
  psVar2 = *(string **)local_98._40_8_;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"animated_positions","");
  XML::childOpt((XML *)local_68,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((_Base_ptr)local_68._0_8_ == (_Base_ptr)0x0) {
    psVar2 = *(string **)uVar5;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"positions","");
    XML::childOpt((XML *)local_98,psVar2);
    loadVec3ffArray((avector<Vec3ff> *)&local_e0,local_a0,(Ref<embree::XML> *)local_98);
    std::
    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                *)&pHVar10->positions,
               (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
               &local_e0);
    alignedFree((void *)local_e0.field_2._8_8_);
    local_e0._M_string_length = 0;
    local_e0.field_2._M_allocated_capacity = 0;
    local_e0.field_2._8_8_ = (void *)0x0;
    if ((XML *)local_98._0_8_ != (XML *)0x0) {
      (*((RefCount *)local_98._0_8_)->_vptr_RefCount[3])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    pXVar3 = *(XML **)local_98._40_8_;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"positions2","");
    bVar7 = XML::hasChild(pXVar3,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (bVar7) {
      psVar2 = *(string **)local_98._40_8_;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"positions2","");
      XML::childOpt((XML *)local_98,psVar2);
      loadVec3ffArray((avector<Vec3ff> *)&local_e0,local_a0,(Ref<embree::XML> *)local_98);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)&pHVar10->positions,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      local_e0._M_string_length = 0;
      local_e0.field_2._M_allocated_capacity = 0;
      local_e0.field_2._8_8_ = (void *)0x0;
      if ((XML *)local_98._0_8_ != (XML *)0x0) {
        (*((RefCount *)local_98._0_8_)->_vptr_RefCount[3])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
    }
  }
  else if (*(_Base_ptr *)(local_68._0_8_ + 0x88) != *(_Base_ptr *)(local_68._0_8_ + 0x80)) {
    uVar12 = 0;
    do {
      XML::child((XML *)&local_c0,local_68._0_8_);
      loadVec3ffArray((avector<Vec3ff> *)&local_e0,local_a0,(Ref<embree::XML> *)&local_c0);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)&pHVar10->positions,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      local_e0._M_string_length = 0;
      local_e0.field_2._M_allocated_capacity = 0;
      local_e0.field_2._8_8_ = (void *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_c0._M_dataplus._M_p + 0x18))();
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)*(_Base_ptr *)(local_68._0_8_ + 0x88) -
                              *(long *)(local_68._0_8_ + 0x80) >> 3));
  }
  if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._0_8_ + 0x18))();
  }
  uVar5 = local_98._40_8_;
  psVar2 = *(string **)local_98._40_8_;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"indices","");
  XML::childOpt((XML *)&local_c0,psVar2);
  loadVec2iArray((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)local_68,local_a0
                 ,(Ref<embree::XML> *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_c0._M_dataplus._M_p + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize(&pHVar10->hairs,(long)(local_68._8_8_ - local_68._0_8_) >> 3);
  if (local_68._8_8_ != local_68._0_8_) {
    siglen = 0;
    do {
      (pHVar10->hairs).
      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
      ._M_impl.super__Vector_impl_data._M_start[siglen] = *(Hair *)(local_68._0_8_ + siglen * 8);
      siglen = siglen + 1;
    } while (siglen < (ulong)((long)(local_68._8_8_ - local_68._0_8_) >> 3));
  }
  pXVar3 = *(XML **)uVar5;
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"tessellation_rate","");
  this_00 = local_98._32_8_;
  XML::parm(&local_e0,pXVar3,&local_c0);
  _Var6._M_p = local_38._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_e0);
  if (iVar8 != 0) {
    uVar9 = atoi(local_e0._M_dataplus._M_p);
    *(uint *)(this_00 + 0x110) = uVar9;
  }
  psVar2 = *(string **)uVar5;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"flags","");
  XML::childOpt((XML *)(local_68 + 0x18),psVar2);
  ctx = local_a0;
  loadUCharArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,local_a0,
                 (Ref<embree::XML> *)(local_68 + 0x18));
  puVar4 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this_00 + 0xf0))->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this_00 + 0xf0))->
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_98._0_8_;
  *(undefined8 *)(this_00 + 0xf8) = local_98._8_8_;
  *(undefined8 *)(this_00 + 0x100) = local_98._16_8_;
  local_98._0_8_ = (XML *)0x0;
  local_98._8_8_ = (pointer)0x0;
  local_98._16_8_ = (element_type *)0x0;
  sig = extraout_RDX;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
    sig = extraout_RDX_00;
  }
  if ((XML *)local_98._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_98._0_8_);
    sig = extraout_RDX_01;
  }
  if ((_Base_ptr)local_68._24_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._24_8_ + 0x18))();
    sig = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
    sig = extraout_RDX_03;
  }
  SceneGraph::HairSetNode::verify((HairSetNode *)this_00,(EVP_PKEY_CTX *)ctx,sig,siglen,in_R8,in_R9)
  ;
  *(undefined8 *)_Var6._M_p = this_00;
  (**(code **)(*(long *)this_00 + 0x10))(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
  (**(code **)(*(long *)this_00 + 0x18))(this_00);
  if ((pointer)local_40._M_p != (pointer)0x0) {
    (*(code *)((*(XML **)local_40._M_p)->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)_Var6._M_p;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBezierCurves(const Ref<XML>& xml, SceneGraph::CurveSubtype subtype)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    RTCGeometryType type = (subtype == SceneGraph::ROUND_CURVE) ? RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE : RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions2")));
    }
    
    std::vector<Vec2i> indices = loadVec2iArray(xml->childOpt("indices"));
    mesh->hairs.resize(indices.size()); 
    for (size_t i=0; i<indices.size(); i++) 
      mesh->hairs[i] = SceneGraph::HairSetNode::Hair(indices[i].x,indices[i].y);

    std::string tessellation_rate = xml->parm("tessellation_rate");
    if (tessellation_rate != "")
      mesh->tessellation_rate = atoi(tessellation_rate.c_str());

    mesh->flags = loadUCharArray(xml->childOpt("flags"));

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }